

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O0

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateF32Mat
          (BuiltInsValidator *this,Decoration *decoration,Instruction *inst,uint32_t req_num_rows,
          uint32_t req_num_columns,
          function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *diag)

{
  function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_00;
  bool bVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  string local_1e8;
  ostringstream local_1c8 [8];
  ostringstream ss;
  uint32_t local_4c;
  spv_result_t error;
  uint32_t component_type;
  uint32_t col_type;
  uint32_t num_cols;
  uint32_t num_rows;
  uint32_t underlying_type;
  function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *diag_local;
  uint32_t req_num_columns_local;
  uint32_t req_num_rows_local;
  Instruction *inst_local;
  Decoration *decoration_local;
  BuiltInsValidator *this_local;
  
  num_cols = 0;
  col_type = 0;
  component_type = 0;
  error = SPV_SUCCESS;
  local_4c = 0;
  _num_rows = diag;
  diag_local._0_4_ = req_num_columns;
  diag_local._4_4_ = req_num_rows;
  _req_num_columns_local = inst;
  inst_local = (Instruction *)decoration;
  decoration_local = (Decoration *)this;
  this_local._4_4_ = GetUnderlyingType(this->_,decoration,inst,&num_cols);
  if (this_local._4_4_ == SPV_SUCCESS) {
    bVar1 = ValidationState_t::GetMatrixTypeInfo
                      (this->_,num_cols,&col_type,&component_type,(uint32_t *)&error,&local_4c);
    if (((bVar1) && (col_type == diag_local._4_4_)) && (component_type == (uint32_t)diag_local)) {
      this_local._4_4_ =
           ValidateF32VecHelper
                     (this,(Decoration *)inst_local,_req_num_columns_local,diag_local._4_4_,
                      _num_rows,error);
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_1c8);
      (anonymous_namespace)::BuiltInsValidator::GetDefinitionDesc_abi_cxx11_
                (&local_1e8,this,(Decoration *)inst_local,_req_num_columns_local);
      poVar2 = std::operator<<((ostream *)local_1c8,(string *)&local_1e8);
      poVar2 = std::operator<<(poVar2," has columns ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,component_type);
      poVar2 = std::operator<<(poVar2," and rows ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,col_type);
      poVar2 = std::operator<<(poVar2," not equal to expected ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint32_t)diag_local);
      poVar2 = std::operator<<(poVar2,"x");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,diag_local._4_4_);
      std::operator<<(poVar2,".");
      std::__cxx11::string::~string((string *)&local_1e8);
      this_00 = _num_rows;
      std::__cxx11::ostringstream::str();
      this_local._4_4_ =
           std::
           function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           ::operator()(this_00,&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::ostringstream::~ostringstream(local_1c8);
    }
  }
  return this_local._4_4_;
}

Assistant:

spv_result_t BuiltInsValidator::ValidateF32Mat(
    const Decoration& decoration, const Instruction& inst,
    uint32_t req_num_rows, uint32_t req_num_columns,
    const std::function<spv_result_t(const std::string& message)>& diag) {
  uint32_t underlying_type = 0;
  uint32_t num_rows = 0;
  uint32_t num_cols = 0;
  uint32_t col_type = 0;
  uint32_t component_type = 0;
  if (spv_result_t error =
          GetUnderlyingType(_, decoration, inst, &underlying_type)) {
    return error;
  }
  if (!_.GetMatrixTypeInfo(underlying_type, &num_rows, &num_cols, &col_type,
                           &component_type) ||
      num_rows != req_num_rows || num_cols != req_num_columns) {
    std::ostringstream ss;
    ss << GetDefinitionDesc(decoration, inst) << " has columns " << num_cols
       << " and rows " << num_rows << " not equal to expected "
       << req_num_columns << "x" << req_num_rows << ".";
    return diag(ss.str());
  }

  return ValidateF32VecHelper(decoration, inst, req_num_rows, diag, col_type);
}